

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  bool bVar1;
  CppType CVar2;
  RepeatedField<int> *pRVar3;
  LogMessage *pLVar4;
  LogFinisher local_152;
  byte local_151;
  LogMessage local_150;
  LogFinisher local_112;
  byte local_111;
  LogMessage local_110;
  LogFinisher local_d2;
  byte local_d1;
  LogMessage local_d0;
  LogFinisher local_95 [20];
  byte local_81;
  LogMessage local_80;
  Extension *local_48;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  byte local_2e;
  FieldType local_2d;
  int value_local;
  bool packed_local;
  FieldType type_local;
  ExtensionSet *pEStack_28;
  int number_local;
  ExtensionSet *this_local;
  ExtensionSet *local_18;
  ExtensionSet *local_10;
  
  extension = (Extension *)descriptor;
  descriptor_local._4_4_ = value;
  local_2e = packed;
  local_2d = type;
  value_local = number;
  pEStack_28 = this;
  bVar1 = MaybeNewExtension(this,number,descriptor,&local_48);
  if (bVar1) {
    local_48->type = local_2d;
    CVar2 = anon_unknown_22::cpp_type(local_48->type);
    local_81 = 0;
    if (CVar2 != CPPTYPE_ENUM) {
      LogMessage::LogMessage
                (&local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x221);
      local_81 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_80,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(local_95,pLVar4);
    }
    if ((local_81 & 1) != 0) {
      LogMessage::~LogMessage(&local_80);
    }
    local_48->is_repeated = true;
    local_48->is_packed = (bool)(local_2e & 1);
    this_local = (ExtensionSet *)this->arena_;
    local_18 = this_local;
    local_10 = this_local;
    pRVar3 = Arena::CreateMessageInternal<google::protobuf::RepeatedField<int>>((Arena *)this_local)
    ;
    (local_48->field_0).repeated_int32_t_value = pRVar3;
  }
  else {
    local_d1 = 0;
    if ((local_48->is_repeated & 1U) == 0) {
      LogMessage::LogMessage
                (&local_d0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x227);
      local_d1 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_d0,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (REPEATED_FIELD): "
                         );
      LogFinisher::operator=(&local_d2,pLVar4);
    }
    if ((local_d1 & 1) != 0) {
      LogMessage::~LogMessage(&local_d0);
    }
    CVar2 = anon_unknown_22::cpp_type(local_48->type);
    local_111 = 0;
    if (CVar2 != CPPTYPE_ENUM) {
      LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x227);
      local_111 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_110,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(&local_112,pLVar4);
    }
    if ((local_111 & 1) != 0) {
      LogMessage::~LogMessage(&local_110);
    }
    local_151 = 0;
    if ((local_48->is_packed & 1U) != (local_2e & 1)) {
      LogMessage::LogMessage
                (&local_150,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x228);
      local_151 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_150,"CHECK failed: (extension->is_packed) == (packed): ");
      LogFinisher::operator=(&local_152,pLVar4);
    }
    if ((local_151 & 1) != 0) {
      LogMessage::~LogMessage(&local_150);
    }
  }
  RepeatedField<int>::Add
            ((local_48->field_0).repeated_int32_t_value,(int *)((long)&descriptor_local + 4));
  return;
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type, bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_packed = packed;
    extension->repeated_enum_value =
        Arena::CreateMessage<RepeatedField<int>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
    GOOGLE_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->repeated_enum_value->Add(value);
}